

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddMessage
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,
          MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Type *local_48;
  Message *prototype;
  RepeatedPtrFieldBase *repeated;
  Message *result;
  MessageFactory *factory_local;
  FieldDescriptor *field_local;
  Message *message_local;
  GeneratedMessageReflection *this_local;
  
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage","Field does not match message type.");
  }
  LVar2 = FieldDescriptor::label(field);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddMessage",CPPTYPE_MESSAGE);
  }
  result = (Message *)factory;
  if (factory == (MessageFactory *)0x0) {
    result = (Message *)this->message_factory_;
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    this_local = (GeneratedMessageReflection *)
                 ExtensionSet::AddMessage(this_00,field,(MessageFactory *)result);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi(field);
    if (bVar1) {
      this_01 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      prototype = (Message *)MapFieldBase::MutableRepeatedField(this_01);
    }
    else {
      prototype = (Message *)
                  MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    }
    repeated = (RepeatedPtrFieldBase *)
               RepeatedPtrFieldBase::
               AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                         ((RepeatedPtrFieldBase *)prototype);
    if (repeated == (RepeatedPtrFieldBase *)0x0) {
      iVar4 = RepeatedPtrFieldBase::size((RepeatedPtrFieldBase *)prototype);
      if (iVar4 == 0) {
        pDVar5 = FieldDescriptor::message_type(field);
        iVar4 = (*(result->super_MessageLite)._vptr_MessageLite[2])(result,pDVar5);
        local_48 = (Type *)CONCAT44(extraout_var,iVar4);
      }
      else {
        local_48 = RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                             ((RepeatedPtrFieldBase *)prototype,0);
      }
      iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])();
      iVar4 = (*(local_48->super_MessageLite)._vptr_MessageLite[4])
                        (local_48,CONCAT44(extraout_var_00,iVar4));
      repeated = (RepeatedPtrFieldBase *)CONCAT44(extraout_var_01,iVar4);
      RepeatedPtrFieldBase::
      UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                ((RepeatedPtrFieldBase *)prototype,(Type *)repeated);
    }
    this_local = (GeneratedMessageReflection *)repeated;
  }
  return (Message *)this_local;
}

Assistant:

Message* GeneratedMessageReflection::AddMessage(
    Message* message, const FieldDescriptor* field,
    MessageFactory* factory) const {
  USAGE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == NULL) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = NULL;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = NULL;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == NULL) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}